

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::Literal::relaxedMaddF64x2
          (Literal *__return_storage_ptr__,Literal *this,Literal *left,Literal *right)

{
  Type *this_00;
  Literal *this_01;
  long lVar1;
  undefined1 local_128 [8];
  LaneArray<2> x;
  LaneArray<2> y;
  LaneArray<2> z;
  Literal local_80;
  undefined1 auStack_68 [8];
  LaneArray<2> r;
  
  getLanesF64x2((LaneArray<2> *)local_128,this);
  getLanesF64x2((LaneArray<2> *)&x._M_elems[1].type,left);
  getLanesF64x2((LaneArray<2> *)&y._M_elems[1].type,right);
  r._M_elems[1].field_0.i64 = 0;
  r._M_elems[1].field_0.func.super_IString.str._M_str = (char *)0x0;
  r._M_elems[0].field_0.func.super_IString.str._M_str = (char *)0x0;
  r._M_elems[0].type.id = 0;
  auStack_68 = (undefined1  [8])0x0;
  r._M_elems[0].field_0.i64 = 0;
  this_00 = &z._M_elems[1].type;
  for (lVar1 = 0; lVar1 != 0x30; lVar1 = lVar1 + 0x18) {
    madd(&local_80,(Literal *)(local_128 + lVar1),(Literal *)((long)&x._M_elems[1].type.id + lVar1),
         (Literal *)((long)&y._M_elems[1].type.id + lVar1));
    Literal((Literal *)this_00,&local_80);
    this_01 = (Literal *)((long)r._M_elems + lVar1 + -8);
    if (this_01 != (Literal *)this_00) {
      ~Literal(this_01);
      Literal(this_01,(Literal *)this_00);
    }
    ~Literal((Literal *)this_00);
    ~Literal(&local_80);
  }
  Literal(__return_storage_ptr__,(LaneArray<2> *)auStack_68);
  std::array<wasm::Literal,_2UL>::~array((array<wasm::Literal,_2UL> *)auStack_68);
  std::array<wasm::Literal,_2UL>::~array((array<wasm::Literal,_2UL> *)&y._M_elems[1].type);
  std::array<wasm::Literal,_2UL>::~array((array<wasm::Literal,_2UL> *)&x._M_elems[1].type);
  std::array<wasm::Literal,_2UL>::~array((array<wasm::Literal,_2UL> *)local_128);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::relaxedMaddF64x2(const Literal& left,
                                  const Literal& right) const {
  return ternary<2, &Literal::getLanesF64x2, &Literal::madd>(
    *this, left, right);
}